

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::rust::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,rust *this,Context *ctx,FieldDescriptor *field)

{
  RustGeneratorContext *pRVar1;
  float fVar2;
  RustFieldType RVar3;
  LogMessage *this_00;
  char *__s;
  AlphaNum *this_01;
  undefined1 auVar4 [16];
  AlphaNum local_f0;
  undefined1 local_c0 [8];
  char *local_b8;
  string local_90;
  AlphaNum local_70;
  string local_40;
  
  unique0x100002cc = local_c0._8_15_;
  RVar3 = GetRustFieldType((FieldDescriptor *)ctx);
  switch(RVar3) {
  case INT32:
    local_f0.piece_._M_len = 0x3f370c;
    local_f0.piece_._M_str = (char *)0x5;
    unique0x10000284 = local_c0._4_12_;
    local_c0._0_4_ = *(undefined4 *)&ctx[3].rust_generator_context_;
    absl::lts_20240722::StrFormat<int>
              (__return_storage_ptr__,(FormatSpec<int> *)&local_f0,(int *)local_c0);
    break;
  case INT64:
    local_f0.piece_._M_len = 0x3f3712;
    local_f0.piece_._M_str = (char *)0x5;
    local_c0 = (size_t)ctx[3].rust_generator_context_;
    absl::lts_20240722::StrFormat<long>
              (__return_storage_ptr__,(FormatSpec<long> *)&local_f0,(long *)local_c0);
    break;
  case UINT32:
    local_f0.piece_._M_len = 0x3f371e;
    local_f0.piece_._M_str = (char *)0x5;
    unique0x10000264 = local_c0._4_12_;
    local_c0._0_4_ = *(undefined4 *)&ctx[3].rust_generator_context_;
    absl::lts_20240722::StrFormat<unsigned_int>
              (__return_storage_ptr__,(FormatSpec<unsigned_int> *)&local_f0,(uint *)local_c0);
    break;
  case UINT64:
    local_f0.piece_._M_len = 0x3f3718;
    local_f0.piece_._M_str = (char *)0x5;
    local_c0 = (size_t)ctx[3].rust_generator_context_;
    absl::lts_20240722::StrFormat<unsigned_long>
              (__return_storage_ptr__,(FormatSpec<unsigned_long> *)&local_f0,
               (unsigned_long *)local_c0);
    break;
  case DOUBLE:
    pRVar1 = ctx[3].rust_generator_context_;
    if ((ulong)ABS((double)pRVar1) < 0x7ff0000000000000) {
      google::protobuf::io::SimpleDtoa_abi_cxx11_((double)pRVar1);
      local_f0.piece_._M_len = (size_t)local_70.piece_._M_str;
      local_f0.piece_._M_str = (char *)local_70.piece_._M_len;
      _local_c0 = absl::lts_20240722::NullSafeStringView("f64");
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_f0);
LAB_0028f00f:
      this_01 = &local_70;
      goto LAB_0028f017;
    }
    if (NAN((double)pRVar1)) {
      __s = "f64::NAN";
    }
    else if ((double)pRVar1 < INFINITY) {
      __s = "f64::NEG_INFINITY";
    }
    else {
      __s = "f64::INFINITY";
    }
    goto LAB_0028f02e;
  case FLOAT:
    fVar2 = *(float *)&ctx[3].rust_generator_context_;
    if ((uint)ABS(fVar2) < 0x7f800000) {
      google::protobuf::io::SimpleFtoa_abi_cxx11_(fVar2);
      local_f0.piece_._M_len = (size_t)local_70.piece_._M_str;
      local_f0.piece_._M_str = (char *)local_70.piece_._M_len;
      _local_c0 = absl::lts_20240722::NullSafeStringView("f32");
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_f0);
      goto LAB_0028f00f;
    }
    if (NAN(fVar2)) {
      __s = "f32::NAN";
    }
    else if (fVar2 < INFINITY) {
      __s = "f32::NEG_INFINITY";
    }
    else {
      __s = "f32::INFINITY";
    }
LAB_0028f02e:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_f0);
    break;
  case BOOL:
    local_f0.piece_._M_len = 0x2cf876;
    local_f0.piece_._M_str = (char *)0x2;
    local_c0[0] = *(undefined1 *)&ctx[3].rust_generator_context_;
    absl::lts_20240722::StrFormat<bool>
              (__return_storage_ptr__,(FormatSpec<bool> *)&local_f0,(bool *)local_c0);
    break;
  case ENUM:
    RsTypePath_abi_cxx11_
              (&local_40,this,ctx,(FieldDescriptor *)&switchD_0028ed2c::switchdataD_003f35d4);
    local_f0.piece_._M_len = local_40._M_string_length;
    local_f0.piece_._M_str = local_40._M_dataplus._M_p;
    _local_c0 = absl::lts_20240722::NullSafeStringView("::");
    auVar4 = google::protobuf::FieldDescriptor::default_value_enum();
    EnumValueRsName_abi_cxx11_(&local_90,auVar4._0_8_,auVar4._8_8_);
    local_70.piece_._M_len = local_90._M_string_length;
    local_70.piece_._M_str = local_90._M_dataplus._M_p;
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)__return_storage_ptr__,&local_f0,(AlphaNum *)local_c0);
    std::__cxx11::string::~string((string *)&local_90);
    this_01 = (AlphaNum *)&local_40;
    goto LAB_0028f017;
  case STRING:
  case BYTES:
    local_b8 = (char *)0x5;
    local_c0 = (size_t)"b\"%s\"";
    absl::lts_20240722::CHexEscape_abi_cxx11_
              (&local_f0,(ctx[3].rust_generator_context_)->import_path_to_crate_name_,
               (ctx[3].rust_generator_context_)->files_in_current_crate_);
    absl::lts_20240722::
    StrFormat<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              (__return_storage_ptr__,(FormatSpec<std::__cxx11::basic_string<char>_> *)local_c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0);
    this_01 = &local_f0;
LAB_0028f017:
    std::__cxx11::string::~string((string *)this_01);
    break;
  case MESSAGE:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/rust/accessors/default_value.cc"
               ,0x58);
    this_00 = absl::lts_20240722::log_internal::LogMessage::operator<<
                        ((LogMessage *)&local_f0,(char (*) [31])"Messages can\'t have defaults: ");
    local_c0 = (size_t)(&FieldDescriptor::kTypeToName)[*(byte *)((long)&ctx->opts_ + 2)];
    absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>
              (this_00,(char **)local_c0);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_f0);
  default:
    absl::lts_20240722::log_internal::LogMessage::LogMessage
              ((LogMessage *)&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/rust/accessors/default_value.cc"
               ,0x5a);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_f0,(char (*) [12])"unreachable");
    absl::lts_20240722::log_internal::LogMessage::~LogMessage((LogMessage *)&local_f0);
    protobuf::internal::Unreachable
              ("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/rust/accessors/default_value.cc"
               ,0x5b);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(Context& ctx, const FieldDescriptor& field) {
  switch (GetRustFieldType(field)) {
    case RustFieldType::DOUBLE:
      if (std::isfinite(field.default_value_double())) {
        return absl::StrCat(io::SimpleDtoa(field.default_value_double()),
                            "f64");
      } else if (std::isnan(field.default_value_double())) {
        return std::string("f64::NAN");
      } else if (field.default_value_double() ==
                 std::numeric_limits<double>::infinity()) {
        return std::string("f64::INFINITY");
      } else if (field.default_value_double() ==
                 -std::numeric_limits<double>::infinity()) {
        return std::string("f64::NEG_INFINITY");
      } else {
        ABSL_LOG(FATAL) << "unreachable";
      }
    case RustFieldType::FLOAT:
      if (std::isfinite(field.default_value_float())) {
        return absl::StrCat(io::SimpleFtoa(field.default_value_float()), "f32");
      } else if (std::isnan(field.default_value_float())) {
        return std::string("f32::NAN");
      } else if (field.default_value_float() ==
                 std::numeric_limits<float>::infinity()) {
        return std::string("f32::INFINITY");
      } else if (field.default_value_float() ==
                 -std::numeric_limits<float>::infinity()) {
        return std::string("f32::NEG_INFINITY");
      } else {
        ABSL_LOG(FATAL) << "unreachable";
      }
    case RustFieldType::INT32:
      return absl::StrFormat("%di32", field.default_value_int32());
    case RustFieldType::INT64:
      return absl::StrFormat("%di64", field.default_value_int64());
    case RustFieldType::UINT64:
      return absl::StrFormat("%uu64", field.default_value_uint64());
    case RustFieldType::UINT32:
      return absl::StrFormat("%uu32", field.default_value_uint32());
    case RustFieldType::BOOL:
      return absl::StrFormat("%v", field.default_value_bool());
    case RustFieldType::STRING:
    case RustFieldType::BYTES:
      return absl::StrFormat("b\"%s\"",
                             absl::CHexEscape(field.default_value_string()));
    case RustFieldType::ENUM:
      // `$EnumName$::default()` might seem like the right choice here, but
      // it is not. The default value for the enum type isn't the same as the
      // field, since in `syntax = "proto2"`, an enum field can have a default
      // value other than the first listed in the enum.
      //
      // Even in cases where there is no custom field default, `default()` can't
      // be used. This is because the vtables for field mutators store the
      // default value. They are `static`s which are constructed with a `const`
      // expression. Trait methods in a `const` context aren't currently stable.
      return absl::StrCat(RsTypePath(ctx, field),
                          "::", EnumValueRsName(*field.default_value_enum()));
    case RustFieldType::MESSAGE:
      ABSL_LOG(FATAL) << "Messages can't have defaults: " << field.type_name();
  }
  ABSL_LOG(ERROR) << "unreachable";
  internal::Unreachable();
}